

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

float loss_cs(cbify *data,v_array<COST_SENSITIVE::wclass> *costs,uint32_t final_prediction)

{
  undefined4 uVar1;
  undefined4 uVar2;
  wclass **ppwVar3;
  int in_EDX;
  v_array<COST_SENSITIVE::wclass> *in_RSI;
  long in_RDI;
  wclass wc;
  wclass *__end1;
  wclass *__begin1;
  v_array<COST_SENSITIVE::wclass> *__range1;
  float cost;
  float local_40;
  int iStack_3c;
  wclass *local_28;
  float local_18;
  
  local_18 = 0.0;
  ppwVar3 = v_array<COST_SENSITIVE::wclass>::begin(in_RSI);
  local_28 = *ppwVar3;
  ppwVar3 = v_array<COST_SENSITIVE::wclass>::end(in_RSI);
  do {
    if (local_28 == *ppwVar3) {
LAB_002852a5:
      return (*(float *)(in_RDI + 0x84) - *(float *)(in_RDI + 0x80)) * local_18 +
             *(float *)(in_RDI + 0x80);
    }
    uVar1 = local_28->x;
    uVar2 = local_28->class_index;
    if (uVar2 == in_EDX) {
      local_18 = (float)uVar1;
      goto LAB_002852a5;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

float loss_cs(cbify& data, v_array<COST_SENSITIVE::wclass>& costs, uint32_t final_prediction)
{
  float cost = 0.;
  for (auto wc : costs)
  {
    if (wc.class_index == final_prediction)
    {
      cost = wc.x;
      break;
    }
  }
  return data.loss0 + (data.loss1 - data.loss0) * cost;
}